

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

QRect __thiscall QPlainTextEdit::cursorRect(QPlainTextEdit *this,QTextCursor *cursor)

{
  QPlainTextEditPrivate *this_00;
  QScrollBar *this_01;
  qreal qVar1;
  char cVar2;
  LayoutDirection LVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  QRect QVar14;
  QRectF r;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  cVar2 = QTextCursor::isNull();
  if (cVar2 == '\0') {
    local_58.w._0_4_ = 0xffffffff;
    local_58.w._4_4_ = 0xffffffff;
    local_58.h._0_4_ = 0xffffffff;
    local_58.h._4_4_ = 0xffffffff;
    local_58.xp._0_4_ = 0xffffffff;
    local_58.xp._4_4_ = 0xffffffff;
    local_58.yp._0_4_ = 0xffffffff;
    local_58.yp._4_4_ = 0xffffffff;
    QWidgetTextControl::cursorRect(&local_58,(QWidgetTextControl *)this_00->control,cursor);
    dVar10 = (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
    dVar9 = 0.0;
    if (0.0 <= dVar10) {
      dVar9 = dVar10;
    }
    dVar8 = dVar10 + (dVar9 - dVar10);
    dVar11 = (double)((ulong)dVar8 & 0x8000000000000000 | 0x3fe0000000000000) + dVar8;
    dVar13 = 2147483647.0;
    if (dVar11 <= 2147483647.0) {
      dVar13 = dVar11;
    }
    dVar12 = (double)(((ulong)local_58.yp._4_4_ & 0x80000000) << 0x20 | 0x3fe0000000000000) +
             (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
    dVar11 = 2147483647.0;
    if (dVar12 <= 2147483647.0) {
      dVar11 = dVar12;
    }
    if (dVar13 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    if (dVar11 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    dVar9 = (dVar8 - (double)(int)dVar13) * 0.5 +
            ((double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_) - (dVar9 - dVar10));
    dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
    dVar10 = 2147483647.0;
    if (dVar9 <= 2147483647.0) {
      dVar10 = dVar9;
    }
    if (dVar10 <= -2147483648.0) {
      dVar10 = -2147483648.0;
    }
    dVar9 = ((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) - (double)(int)dVar11) * 0.5 +
            (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
    dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
    dVar8 = 2147483647.0;
    if (dVar9 <= 2147483647.0) {
      dVar8 = dVar9;
    }
    if (dVar8 <= -2147483648.0) {
      dVar8 = -2147483648.0;
    }
    LVar3 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    this_01 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar3 == RightToLeft) {
      iVar4 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
      iVar5 = QAbstractSlider::value
                        (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider)
      ;
      iVar4 = iVar4 - iVar5;
    }
    else {
      iVar4 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
    }
    qVar1 = QPlainTextEditPrivate::verticalOffset
                      (this_00,this_00->control->topBlock,this_00->topLine);
    iVar5 = (int)(qVar1 + this_00->topLineFracture);
    uVar6 = CONCAT44((int)dVar11 - iVar5,(int)dVar13 - iVar4);
    uVar7 = CONCAT44(((int)dVar11 + (int)dVar8 + -1) - iVar5,
                     ((int)dVar13 + (int)dVar10 + -1) - iVar4);
  }
  else {
    uVar7 = 0xffffffffffffffff;
    uVar6 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar14.x2.m_i = (int)uVar7;
    QVar14.y2.m_i = (int)((ulong)uVar7 >> 0x20);
    QVar14.x1.m_i = (int)uVar6;
    QVar14.y1.m_i = (int)((ulong)uVar6 >> 0x20);
    return QVar14;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPlainTextEdit::cursorRect(const QTextCursor &cursor) const
{
    Q_D(const QPlainTextEdit);
    if (cursor.isNull())
        return QRect();

    QRect r = d->control->cursorRect(cursor).toRect();
    r.translate(-d->horizontalOffset(),-(int)d->verticalOffset());
    return r;
}